

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replay.cpp
# Opt level: O3

void printInfo(void)

{
  int i_2;
  long lVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  char (*__s) [26];
  int i;
  long lVar7;
  
  printf("Round %d:  %d vs %d\n",(ulong)(uint)turnID,(ulong)(uint)gameBoard.elimTotal[0],
         (ulong)(uint)gameBoard.elimTotal[1]);
  printf("count:");
  lVar7 = 0;
  do {
    printf(" %d",(ulong)(uint)gameBoard.typeCountForColor[0][lVar7]);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 7);
  printf("\ncount:");
  lVar7 = 0;
  do {
    printf(" %d",(ulong)(uint)gameBoard.typeCountForColor[1][lVar7]);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 7);
  putchar(10);
  putchar(10);
  uVar3 = 0x14;
  __s = printInfo::ans;
  do {
    sprintf(*__s,"%2d",uVar3 & 0xffffffff);
    __s = __s + 1;
    uVar3 = uVar3 - 1;
  } while (uVar3 != 0);
  lVar7 = 0x18;
  do {
    printInfo::ans[0][lVar7] = '|';
    *(undefined1 *)(lVar7 + 0x121cb5) = 0x7c;
    *(undefined1 *)((long)&val.limit_ + lVar7 + 2) = 0x7c;
    lVar7 = lVar7 + 0x1a;
  } while (lVar7 != 0x220);
  lVar7 = 1;
  lVar1 = 0x121eb1;
  lVar5 = 0x1212a8;
  do {
    lVar6 = 0;
    do {
      *(char *)(lVar1 + lVar6) = " *+"[*(int *)(lVar5 + lVar6 * 4)];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 10);
    lVar7 = lVar7 + 1;
    lVar1 = lVar1 + -0x1a;
    lVar5 = lVar5 + 0x30;
  } while (lVar7 != 0x15);
  lVar7 = 1;
  lVar1 = 0x121ebc;
  lVar5 = 0x1216c8;
  do {
    lVar6 = 0;
    do {
      *(char *)(lVar1 + lVar6) = " *+"[*(int *)(lVar5 + lVar6 * 4)];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 10);
    lVar7 = lVar7 + 1;
    lVar1 = lVar1 + -0x1a;
    lVar5 = lVar5 + 0x30;
  } while (lVar7 != 0x15);
  lVar7 = 0;
  do {
    puts(printInfo::ans[0] + lVar7);
    lVar7 = lVar7 + 0x1a;
  } while (lVar7 != 0x208);
  printf("  ");
  iVar2 = 0x17;
  do {
    putchar(0x2d);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  printf("\n   ");
  iVar2 = -10;
  do {
    uVar4 = iVar2 + 0xb;
    iVar2 = iVar2 + 1;
    if (iVar2 == 0) {
      uVar4 = 0;
    }
    printf("%d",(ulong)uVar4);
  } while (iVar2 != 0);
  putchar(0x7c);
  iVar2 = -10;
  do {
    uVar4 = iVar2 + 0xb;
    iVar2 = iVar2 + 1;
    if (iVar2 == 0) {
      uVar4 = 0;
    }
    printf("%d",(ulong)uVar4);
  } while (iVar2 != 0);
  putchar(10);
  getchar();
  return;
}

Assistant:

void printInfo()
{
    printf("Round %d:  %d vs %d\n", turnID, gameBoard.elimTotal[0], gameBoard.elimTotal[1]);
    printf("count:");
    for (int i = 0; i < 7; ++i)
        printf(" %d", gameBoard.typeCountForColor[0][i]);
    printf("\ncount:");
    for (int i = 0; i < 7; ++i)
        printf(" %d", gameBoard.typeCountForColor[1][i]);
    putchar('\n');
    putchar('\n');
    static char ans[20][26] = {};
    for (int i = 1; i <= 20; ++i)
        sprintf(ans[i - 1], "%2d", 21 - i);
    for (int i = 0; i < 20; ++i)
        ans[i][2] = ans[i][13] = ans[i][24] = '|';
    static const char mp[3] = {' ', '*', '+'};
    for (int i = 1; i <= 20; ++i)
        for (int j = 1; j <= 10; ++j)
            ans[20 - i][2 + j] = mp[gameBoard.gridInfo[0][i][j]];
    for (int i = 1; i <= 20; ++i)
        for (int j = 1; j <= 10; ++j)
            ans[20 - i][13 + j] = mp[gameBoard.gridInfo[1][i][j]];
    for (int i = 0; i < 20; ++i)
        puts(ans[i]);
    printf("  ");
    for (int i = 0; i < 23; ++i)
        putchar('-');
    printf("\n   ");
    for (int i = 1; i <= 10; ++i)
        printf("%d", i % 10);
    putchar('|');
    for (int i = 1; i <= 10; ++i)
        printf("%d", i % 10);
    putchar('\n');
    getchar();
}